

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

char * __thiscall
gl4cts::GPUShaderFP64Test1::getUniformFunctionString
          (GPUShaderFP64Test1 *this,_uniform_function func)

{
  char *local_20;
  char *result;
  _uniform_function func_local;
  GPUShaderFP64Test1 *this_local;
  
  local_20 = "[?]";
  switch(func) {
  case UNIFORM_FUNCTION_1D:
    local_20 = "glUniform1d";
    break;
  case UNIFORM_FUNCTION_1DV:
    local_20 = "glUniform1dv";
    break;
  case UNIFORM_FUNCTION_2D:
    local_20 = "glUniform2d";
    break;
  case UNIFORM_FUNCTION_2DV:
    local_20 = "glUniform2dv";
    break;
  case UNIFORM_FUNCTION_3D:
    local_20 = "glUniform3d";
    break;
  case UNIFORM_FUNCTION_3DV:
    local_20 = "glUniform3dv";
    break;
  case UNIFORM_FUNCTION_4D:
    local_20 = "glUniform4d";
    break;
  case UNIFORM_FUNCTION_4DV:
    local_20 = "glUniform4dv";
    break;
  case UNIFORM_FUNCTION_MATRIX2DV:
    local_20 = "glUniformMatrix2dv";
    break;
  case UNIFORM_FUNCTION_MATRIX2X3DV:
    local_20 = "glUniformMatrix2x3dv";
    break;
  case UNIFORM_FUNCTION_MATRIX2X4DV:
    local_20 = "glUniformMatrix2x4dv";
    break;
  case UNIFORM_FUNCTION_MATRIX3DV:
    local_20 = "glUniformMatrix3dv";
    break;
  case UNIFORM_FUNCTION_MATRIX3X2DV:
    local_20 = "glUniformMatrix3x2dv";
    break;
  case UNIFORM_FUNCTION_MATRIX3X4DV:
    local_20 = "glUniformMatrix3x4dv";
    break;
  case UNIFORM_FUNCTION_MATRIX4DV:
    local_20 = "glUniformMatrix4dv";
    break;
  case UNIFORM_FUNCTION_MATRIX4X2DV:
    local_20 = "glUniformMatrix4x2dv";
    break;
  case UNIFORM_FUNCTION_MATRIX4X3DV:
    local_20 = "glUniformMatrix4x3dv";
  }
  return local_20;
}

Assistant:

const char* GPUShaderFP64Test1::getUniformFunctionString(_uniform_function func)
{
	const char* result = "[?]";

	switch (func)
	{
	case UNIFORM_FUNCTION_1D:
		result = "glUniform1d";
		break;
	case UNIFORM_FUNCTION_1DV:
		result = "glUniform1dv";
		break;
	case UNIFORM_FUNCTION_2D:
		result = "glUniform2d";
		break;
	case UNIFORM_FUNCTION_2DV:
		result = "glUniform2dv";
		break;
	case UNIFORM_FUNCTION_3D:
		result = "glUniform3d";
		break;
	case UNIFORM_FUNCTION_3DV:
		result = "glUniform3dv";
		break;
	case UNIFORM_FUNCTION_4D:
		result = "glUniform4d";
		break;
	case UNIFORM_FUNCTION_4DV:
		result = "glUniform4dv";
		break;
	case UNIFORM_FUNCTION_MATRIX2DV:
		result = "glUniformMatrix2dv";
		break;
	case UNIFORM_FUNCTION_MATRIX2X3DV:
		result = "glUniformMatrix2x3dv";
		break;
	case UNIFORM_FUNCTION_MATRIX2X4DV:
		result = "glUniformMatrix2x4dv";
		break;
	case UNIFORM_FUNCTION_MATRIX3DV:
		result = "glUniformMatrix3dv";
		break;
	case UNIFORM_FUNCTION_MATRIX3X2DV:
		result = "glUniformMatrix3x2dv";
		break;
	case UNIFORM_FUNCTION_MATRIX3X4DV:
		result = "glUniformMatrix3x4dv";
		break;
	case UNIFORM_FUNCTION_MATRIX4DV:
		result = "glUniformMatrix4dv";
		break;
	case UNIFORM_FUNCTION_MATRIX4X2DV:
		result = "glUniformMatrix4x2dv";
		break;
	case UNIFORM_FUNCTION_MATRIX4X3DV:
		result = "glUniformMatrix4x3dv";
		break;
	default:
		break;
	}

	return result;
}